

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O1

int __thiscall glcts::anon_unknown_0::UniformType::abs(UniformType *this,int __x)

{
  GLenum GVar1;
  
  GVar1 = this->baseType;
  if ((int)GVar1 < 0x1406) {
    if (GVar1 == 0x1404) {
      return 0x1a356b4;
    }
    if (GVar1 == 0x1405) {
      return 0x1b0f662;
    }
  }
  else if ((GVar1 == 0x1406) || (GVar1 == 0x82e6)) {
    return 0x1b663db;
  }
  __assert_fail("0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cExplicitUniformLocationTest.cpp"
                ,0x14e,"const char *glcts::(anonymous namespace)::UniformType::abs() const");
}

Assistant:

const char* abs() const
	{
		switch (baseType)
		{
		case GL_FLOAT:
		case GL_SAMPLER:
			return "0.1";
		case GL_UNSIGNED_INT:
			return "0u";
		case GL_INT:
			return "0";
		default:
			assert(0);
			return "";
		}
	}